

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O2

Type * __thiscall Expr::DataType(Expr *this,Env *env)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Type *pTVar4;
  Type *type2;
  undefined4 extraout_var;
  ExternType *pEVar5;
  CaseExprList *pCVar6;
  ExternType *type2_00;
  ExternType *pEVar7;
  undefined4 extraout_var_00;
  Exception *pEVar8;
  ExternType *pEVar9;
  pointer ppCVar10;
  undefined8 local_b0 [4];
  undefined8 local_90 [4];
  string local_70;
  string local_50;
  
LAB_00117f0a:
  switch(this->expr_type_) {
  case EXPR_ID:
    pTVar4 = Env::GetDataType(env,this->id_);
    return pTVar4;
  case EXPR_NUM:
  case EXPR_SIZEOF:
  case EXPR_OFFSETOF:
  case EXPR_NEG:
  case EXPR_PLUS:
  case EXPR_MINUS:
  case EXPR_TIMES:
  case EXPR_DIV:
  case EXPR_MOD:
  case EXPR_BITNOT:
  case EXPR_BITAND:
  case EXPR_BITOR:
  case EXPR_BITXOR:
  case EXPR_LSHIFT:
  case EXPR_RSHIFT:
  case EXPR_EQUAL:
  case EXPR_GE:
  case EXPR_LE:
  case EXPR_GT:
  case EXPR_LT:
  case EXPR_NOT:
  case EXPR_AND:
  case EXPR_OR:
    return &extern_type_int->super_Type;
  case EXPR_SUBSCRIPT:
    pTVar4 = DataType(this->operand_[0],env);
    iVar2 = (*(pTVar4->super_DataDepElement)._vptr_DataDepElement[0xe])(pTVar4);
    return (Type *)CONCAT44(extraout_var,iVar2);
  case EXPR_MEMBER:
    pTVar4 = DataType(this->operand_[0],env);
    if (pTVar4 != (Type *)0x0) {
      iVar2 = (*(pTVar4->super_DataDepElement)._vptr_DataDepElement[0xd])
                        (pTVar4,this->operand_[1]->id_);
      return (Type *)CONCAT44(extraout_var_00,iVar2);
    }
    break;
  case EXPR_PAREN:
  case EXPR_CALL:
    goto switchD_00117f1e_caseD_6;
  case EXPR_COND:
    pTVar4 = DataType(this->operand_[1],env);
    type2 = DataType(this->operand_[2],env);
    bVar1 = Type::CompatibleTypes(pTVar4,type2);
    if (bVar1) {
      return pTVar4;
    }
    pEVar8 = (Exception *)__cxa_allocate_exception(0x20);
    (*(pTVar4->super_DataDepElement)._vptr_DataDepElement[0xb])(local_90,pTVar4);
    (*(type2->super_DataDepElement)._vptr_DataDepElement[0xb])(local_b0,type2);
    strfmt_abi_cxx11_(&local_50,"type mismatch: %s vs %s",local_90[0],local_b0[0]);
    Exception::Exception(pEVar8,&this->super_Object,&local_50);
    __cxa_throw(pEVar8,&Exception::typeinfo,Exception::~Exception);
  case EXPR_CASE:
    pCVar6 = this->cases_;
    if ((pCVar6 != (CaseExprList *)0x0) &&
       (ppCVar10 = (pCVar6->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
                   super__Vector_impl_data._M_start,
       ppCVar10 !=
       (pCVar6->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
       super__Vector_impl_data._M_finish)) {
      pEVar5 = (ExternType *)DataType((*ppCVar10)->value_,env);
      pCVar6 = this->cases_;
      if (pCVar6 == (CaseExprList *)0x0) {
        pEVar9 = (ExternType *)0x0;
      }
      else {
        pEVar9 = (ExternType *)0x0;
        for (ppCVar10 = (pCVar6->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            ppCVar10 !=
            (pCVar6->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
            super__Vector_impl_data._M_finish; ppCVar10 = ppCVar10 + 1) {
          type2_00 = (ExternType *)DataType((*ppCVar10)->value_,env);
          bVar1 = Type::CompatibleTypes(&pEVar5->super_Type,(Type *)type2_00);
          if (!bVar1) {
            pEVar8 = (Exception *)__cxa_allocate_exception(0x20);
            (*(pEVar5->super_Type).super_DataDepElement._vptr_DataDepElement[0xb])(local_90,pEVar5);
            (*(type2_00->super_Type).super_DataDepElement._vptr_DataDepElement[0xb])
                      (local_b0,type2_00);
            strfmt_abi_cxx11_(&local_70,"type mismatch: %s vs %s",local_90[0],local_b0[0]);
            Exception::Exception(pEVar8,&this->super_Object,&local_70);
            __cxa_throw(pEVar8,&Exception::typeinfo,Exception::~Exception);
          }
          pEVar7 = type2_00;
          if (pEVar5 != extern_type_nullptr) {
            pEVar7 = pEVar5;
          }
          pEVar5 = pEVar9;
          if (((type2_00 != (ExternType *)0x0) &&
              (iVar2 = (*(type2_00->super_Type).super_DataDepElement._vptr_DataDepElement[0x11])
                                 (type2_00), (char)iVar2 != '\0')) &&
             (pEVar5 = type2_00, pEVar9 != (ExternType *)0x0)) {
            iVar2 = 4;
            if ((pEVar9->super_Type).tot_ != EXTERN) {
              iVar2 = (*(pEVar9->super_Type).super_DataDepElement._vptr_DataDepElement[0x13])
                                (pEVar9,env);
            }
            iVar3 = 4;
            if ((type2_00->super_Type).tot_ != EXTERN) {
              iVar3 = (*(type2_00->super_Type).super_DataDepElement._vptr_DataDepElement[0x13])
                                (type2_00,env);
            }
            if (iVar3 <= iVar2) {
              pEVar5 = pEVar9;
            }
          }
          pCVar6 = this->cases_;
          pEVar9 = pEVar5;
          pEVar5 = pEVar7;
        }
      }
      if (pEVar9 != (ExternType *)0x0) {
        pEVar5 = pEVar9;
      }
      return &pEVar5->super_Type;
    }
  }
  return (Type *)0x0;
switchD_00117f1e_caseD_6:
  this = this->operand_[0];
  goto LAB_00117f0a;
}

Assistant:

Type* Expr::DataType(Env* env) const
	{
	Type* data_type;

	switch ( expr_type_ )
		{
		case EXPR_ID:
			data_type = env->GetDataType(id_);
			break;

		case EXPR_MEMBER:
			{
			// Get type of the parent
			Type* parent_type = operand_[0]->DataType(env);
			if ( ! parent_type )
				return nullptr;
			data_type = parent_type->MemberDataType(operand_[1]->id());
			}
			break;

		case EXPR_SUBSCRIPT:
			{
			// Get type of the parent
			Type* parent_type = operand_[0]->DataType(env);
			data_type = parent_type->ElementDataType();
			}
			break;

		case EXPR_PAREN:
			data_type = operand_[0]->DataType(env);
			break;

		case EXPR_COND:
			{
			Type* type1 = operand_[1]->DataType(env);
			Type* type2 = operand_[2]->DataType(env);
			if ( ! Type::CompatibleTypes(type1, type2) )
				{
				throw Exception(this,
				                strfmt("type mismatch: %s vs %s", type1->DataTypeStr().c_str(),
				                       type2->DataTypeStr().c_str()));
				}
			data_type = type1;
			}
			break;

		case EXPR_CALL:
			data_type = operand_[0]->DataType(env);
			break;

		case EXPR_CASE:
			{
			if ( cases_ && ! cases_->empty() )
				{
				Type* type1 = cases_->front()->value()->DataType(env);
				Type* numeric_with_largest_width = nullptr;

				foreach (i, CaseExprList, cases_)
					{
					Type* type2 = (*i)->value()->DataType(env);
					if ( ! Type::CompatibleTypes(type1, type2) )
						{
						throw Exception(this, strfmt("type mismatch: %s vs %s",
						                             type1->DataTypeStr().c_str(),
						                             type2->DataTypeStr().c_str()));
						}
					if ( type1 == extern_type_nullptr )
						type1 = type2;

					if ( type2 && type2->IsNumericType() )
						{
						if ( numeric_with_largest_width )
							{
							int largest;
							int contender;

							// External C++ types like "int", "bool", "enum" use "int"
							// storage internally.
							if ( numeric_with_largest_width->tot() == Type::EXTERN )
								largest = sizeof(int);
							else
								largest = numeric_with_largest_width->StaticSize(env);

							if ( type2->tot() == Type::EXTERN )
								contender = sizeof(int);
							else
								contender = type2->StaticSize(env);

							if ( contender > largest )
								numeric_with_largest_width = type2;
							}
						else
							numeric_with_largest_width = type2;
						}
					}
				data_type = numeric_with_largest_width ? numeric_with_largest_width : type1;
				}
			else
				data_type = nullptr;
			}
			break;

		case EXPR_NUM:
		case EXPR_SIZEOF:
		case EXPR_OFFSETOF:
		case EXPR_NEG:
		case EXPR_PLUS:
		case EXPR_MINUS:
		case EXPR_TIMES:
		case EXPR_DIV:
		case EXPR_MOD:
		case EXPR_BITNOT:
		case EXPR_BITAND:
		case EXPR_BITOR:
		case EXPR_BITXOR:
		case EXPR_LSHIFT:
		case EXPR_RSHIFT:
		case EXPR_EQUAL:
		case EXPR_GE:
		case EXPR_LE:
		case EXPR_GT:
		case EXPR_LT:
		case EXPR_NOT:
		case EXPR_AND:
		case EXPR_OR:
			data_type = extern_type_int;
			break;

		default:
			data_type = nullptr;
			break;
		}

	return data_type;
	}